

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_InterpolateView(player_t *player,double Frac,InterpolationViewer *iview)

{
  double *pdVar1;
  extsector_t *scalar;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  subsector_t *psVar5;
  DVector3a *pDVar6;
  TVector2<double> *v2;
  instance *piVar7;
  TVector3<double> *pTVar8;
  double dVar9;
  double dVar10;
  DVector3a *local_3d8;
  DVector3a *local_3c8;
  TVector2<double> local_3b8;
  undefined1 local_3a8 [32];
  undefined1 local_388 [31];
  bool moved;
  TAngle<double> local_360;
  TAngle<double> local_358;
  TAngle<double> local_350;
  TAngle<double> local_348;
  TAngle<double> local_340;
  TAngle<double> local_338;
  TAngle<double> local_330;
  TAngle<double> local_328;
  TAngle<double> local_320;
  TAngle<double> local_318;
  TAngle<double> local_310;
  TAngle<double> local_308;
  TAngle<double> local_300;
  TAngle<double> local_2f8;
  TAngle<double> local_2f0;
  TAngle<double> local_2e8;
  TAngle<double> local_2e0;
  TAngle<double> local_2d8;
  TAngle<double> local_2d0;
  TAngle<double> local_2c8;
  DAngle delta;
  TAngle<double> local_2b8;
  TVector3<double> local_2b0;
  TVector3<double> local_298;
  TVector3<double> local_280;
  TVector3<double> local_268;
  undefined1 local_250 [8];
  DVector2 disp;
  undefined1 local_228 [40];
  TVector3<double> local_200;
  TVector3<double> local_1e8;
  TVector3<double> local_1d0;
  TVector3<double> local_1b8;
  undefined1 local_1a0 [8];
  DVector2 viewpos;
  TAngle<double> local_188;
  TAngle<double> local_180;
  extsector_t *local_178;
  double fragfrac;
  TVector3<double> local_168;
  double local_150;
  double fraglen;
  DVector3a *end_1;
  DVector3a *start_1;
  double dStack_130;
  uint i_1;
  double interpolatedlen;
  TVector3<double> local_120;
  DVector3a *local_108;
  DVector3a *end;
  DVector3a *start;
  undefined1 local_f0 [4];
  uint i;
  DVector3a newpos;
  DVector3a oldpos;
  double nviewz;
  double oviewz;
  DAngle totaladiff;
  DAngle adiff;
  double totalzdiff;
  double zdiff;
  double pathlen;
  DVector3 view;
  DAngle nviewangle;
  DAngle oviewangle;
  undefined1 local_38 [4];
  int newgroup;
  int local_24;
  InterpolationViewer *pIStack_20;
  int oldgroup;
  InterpolationViewer *iview_local;
  double Frac_local;
  player_t *player_local;
  
  pIStack_20 = iview;
  iview_local = (InterpolationViewer *)Frac;
  Frac_local = (double)player;
  if (NoInterpolateView) {
    TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
    NoInterpolateView = false;
    InterpolationViewer::instance::operator=(&pIStack_20->Old,&pIStack_20->New);
  }
  TVector2<double>::TVector2((TVector2<double> *)local_38,&(pIStack_20->Old).Pos);
  psVar5 = R_PointInSubsector((DVector2 *)local_38);
  local_24 = psVar5->sector->PortalGroup;
  TVector2<double>::TVector2((TVector2<double> *)&oviewangle,&(pIStack_20->New).Pos);
  R_PointInSubsector((DVector2 *)&oviewangle);
  TAngle<double>::TAngle(&nviewangle,&(pIStack_20->Old).Angles.Yaw);
  TAngle<double>::TAngle((TAngle<double> *)&view.Z,&(pIStack_20->New).Angles.Yaw);
  bVar2 = FBoolCVar::operator_cast_to_bool(&cl_capfps);
  if (bVar2) {
    TVector3<double>::operator=(&ViewPos,&(pIStack_20->New).Pos);
    pTVar8 = TVector3<double>::operator=(ViewPath + 1,&(pIStack_20->New).Pos);
    TVector3<double>::operator=(ViewPath,pTVar8);
  }
  else {
    dVar10 = (pIStack_20->Old).Pos.X;
    if (((((dVar10 == (pIStack_20->New).Pos.X) && (!NAN(dVar10) && !NAN((pIStack_20->New).Pos.X)))
         && (dVar10 = (pIStack_20->Old).Pos.Y, pdVar1 = &(pIStack_20->New).Pos.Y, dVar10 == *pdVar1)
         ) && (!NAN(dVar10) && !NAN(*pdVar1))) ||
       (uVar3 = TArray<DVector3a,_DVector3a>::Size(&InterpolationPath), uVar3 == 0)) {
      FDisplacementTable::getOffset((FDisplacementTable *)local_250,0x1af5e78,local_24);
      piVar7 = &pIStack_20->Old;
      TVector3<double>::operator-(&local_2b0,&(pIStack_20->New).Pos,&(pIStack_20->Old).Pos);
      operator-(&local_298,&local_2b0,(Vector2 *)local_250);
      operator*(&local_280,&local_298,(double)iview_local);
      TVector3<double>::operator+(&local_268,&piVar7->Pos,&local_280);
      TVector3<double>::operator=(&ViewPos,&local_268);
      pTVar8 = TVector3<double>::operator=(ViewPath + 1,&(pIStack_20->New).Pos);
      TVector3<double>::operator=(ViewPath,pTVar8);
    }
    else {
      TVector3<double>::TVector3((TVector3<double> *)&pathlen,&(pIStack_20->New).Pos);
      if ((r_showviewer & 1U) == 0) {
        zdiff = 0.0;
        totalzdiff = 0.0;
        adiff.Degrees = 0.0;
        TAngle<double>::TAngle(&totaladiff,0.0);
        TAngle<double>::TAngle((TAngle<double> *)&oviewz,0.0);
        dVar10 = (pIStack_20->Old).Pos.Z;
        oldpos.angle.Degrees = (pIStack_20->New).Pos.Z;
        TVector3<double>::TVector3
                  ((TVector3<double> *)&newpos.angle,(pIStack_20->Old).Pos.X,(pIStack_20->Old).Pos.Y
                   ,0.0);
        TAngle<double>::TAngle((TAngle<double> *)&oldpos.pos.Z,0.0);
        TVector3<double>::TVector3
                  ((TVector3<double> *)local_f0,(pIStack_20->New).Pos.X,(pIStack_20->New).Pos.Y,0.0)
        ;
        TAngle<double>::TAngle((TAngle<double> *)&newpos.pos.Z,0.0);
        TArray<DVector3a,_DVector3a>::Push(&InterpolationPath,(DVector3a *)local_f0);
        for (start._4_4_ = 0; uVar3 = start._4_4_,
            uVar4 = TArray<DVector3a,_DVector3a>::Size(&InterpolationPath), uVar3 < uVar4;
            start._4_4_ = start._4_4_ + 2) {
          if (start._4_4_ == 0) {
            local_3c8 = (DVector3a *)&newpos.angle;
          }
          else {
            local_3c8 = TArray<DVector3a,_DVector3a>::operator[]
                                  (&InterpolationPath,(ulong)(start._4_4_ - 1));
          }
          end = local_3c8;
          local_108 = TArray<DVector3a,_DVector3a>::operator[]
                                (&InterpolationPath,(ulong)start._4_4_);
          TVector3<double>::operator-(&local_120,&local_108->pos,&end->pos);
          dVar9 = TVector3<double>::Length(&local_120);
          zdiff = dVar9 + zdiff;
          adiff.Degrees = (end->pos).Z + adiff.Degrees;
          TAngle<double>::TAngle((TAngle<double> *)&interpolatedlen,&end->angle);
          TAngle<double>::operator+=((TAngle<double> *)&oviewz,(TAngle<double> *)&interpolatedlen);
        }
        dStack_130 = (double)iview_local * zdiff;
        for (start_1._4_4_ = 0; uVar3 = start_1._4_4_,
            uVar4 = TArray<DVector3a,_DVector3a>::Size(&InterpolationPath), uVar3 < uVar4;
            start_1._4_4_ = start_1._4_4_ + 2) {
          if (start_1._4_4_ == 0) {
            local_3d8 = (DVector3a *)&newpos.angle;
          }
          else {
            local_3d8 = TArray<DVector3a,_DVector3a>::operator[]
                                  (&InterpolationPath,(ulong)(start_1._4_4_ - 1));
          }
          end_1 = local_3d8;
          fraglen = (double)TArray<DVector3a,_DVector3a>::operator[]
                                      (&InterpolationPath,(ulong)start_1._4_4_);
          TVector3<double>::operator-(&local_168,(TVector3<double> *)fraglen,&end_1->pos);
          local_150 = TVector3<double>::Length(&local_168);
          totalzdiff = (end_1->pos).Z + totalzdiff;
          TAngle<double>::TAngle((TAngle<double> *)&fragfrac,&end_1->angle);
          TAngle<double>::operator+=(&totaladiff,(TAngle<double> *)&fragfrac);
          if (dStack_130 < local_150) {
            local_178 = (extsector_t *)(dStack_130 / local_150);
            dVar10 = totalzdiff + dVar10;
            oldpos.angle.Degrees = oldpos.angle.Degrees - (adiff.Degrees - totalzdiff);
            TAngle<double>::TAngle(&local_180,&totaladiff);
            TAngle<double>::operator+=(&nviewangle,&local_180);
            TAngle<double>::TAngle((TAngle<double> *)&viewpos.Y,&totaladiff);
            TAngle<double>::operator-(&local_188,(TAngle<double> *)&oviewz);
            TAngle<double>::operator-=((TAngle<double> *)&view.Z,&local_188);
            pDVar6 = end_1;
            scalar = local_178;
            TVector3<double>::operator-(&local_1e8,(TVector3<double> *)fraglen,&end_1->pos);
            operator*(&local_1d0,(double)scalar,&local_1e8);
            TVector3<double>::operator+(&local_1b8,&pDVar6->pos,&local_1d0);
            TVector2<double>::TVector2((TVector2<double> *)local_1a0,&local_1b8);
            TVector3<double>::TVector3
                      (&local_200,(Vector2 *)local_1a0,
                       dVar10 + (double)iview_local * (oldpos.angle.Degrees - dVar10));
            TVector3<double>::operator=(&ViewPos,&local_200);
            break;
          }
          dStack_130 = dStack_130 - local_150;
        }
        TArray<DVector3a,_DVector3a>::Pop(&InterpolationPath);
        TVector3<double>::operator=(ViewPath,&(pIStack_20->Old).Pos);
        pDVar6 = TArray<DVector3a,_DVector3a>::operator[](&InterpolationPath,0);
        TVector3<double>::operator-((TVector3<double> *)&disp.Y,&pDVar6->pos,ViewPath);
        TVector3<double>::XY((TVector3<double> *)local_228);
        v2 = TVector2<double>::MakeResize((TVector2<double> *)local_228,zdiff);
        operator+((TVector3<double> *)(local_228 + 0x10),ViewPath,v2);
        TVector3<double>::operator=(ViewPath + 1,(TVector3<double> *)(local_228 + 0x10));
      }
    }
  }
  if (((Frac_local != 0.0) && ((*(uint *)((long)Frac_local + 0xe8) & 0x4000) == 0)) &&
     ((((long)Frac_local + -0x1ae70c0) / 0x2a0 == (long)consoleplayer &&
      ((camera == *(AActor **)Frac_local && ((demoplayback & 1U) == 0)))))) {
    dVar10 = (pIStack_20->New).Pos.X;
    dVar9 = AActor::X(camera);
    if ((dVar10 == dVar9) && (!NAN(dVar10) && !NAN(dVar9))) {
      dVar10 = (pIStack_20->New).Pos.Y;
      dVar9 = AActor::Y(camera);
      if ((((((dVar10 == dVar9) && (!NAN(dVar10) && !NAN(dVar9))) &&
            ((*(uint *)((long)Frac_local + 0xe8) & 0x1040) == 0)) &&
           ((*(char *)((long)Frac_local + 8) == '\0' && (*(int *)(*(long *)Frac_local + 0x220) == 0)
            ))) && (((NoInterpolateView & 1U) == 0 && (paused == 0)))) &&
         ((((netgame & 1U) == 0 ||
           (bVar2 = FBoolCVar::operator_cast_to_bool(&cl_noprediction), !bVar2)) &&
          ((LocalKeyboardTurner & 1U) == 0)))) {
        dVar10 = AngleToFloat(LocalViewAngle & 0xffff0000);
        TAngle<double>::operator+(&delta,dVar10);
        TAngle<double>::Normalized180(&local_2b8);
        TAngle<double>::operator=(&ViewAngle,&local_2b8);
        if ((*(byte *)((long)Frac_local + 0x90) & 1) == 0) {
          dVar10 = AngleToFloat(LocalViewPitch & 0xffff0000);
          TAngle<double>::TAngle(&local_2c8,dVar10);
        }
        else {
          TAngle<double>::TAngle(&local_2c8,0.0);
        }
        piVar7 = &pIStack_20->New;
        TAngle<double>::TAngle(&local_2e8,&local_2c8);
        TAngle<double>::operator-(&local_2e0,&(piVar7->Angles).Pitch);
        TAngle<double>::Normalized180(&local_2d8);
        TAngle<double>::TAngle(&local_2f0,(TAngle<double> *)((long)Frac_local + 0x1b8));
        TAngle<double>::TAngle(&local_2f8,(TAngle<double> *)((long)Frac_local + 0x1c0));
        clamp<TAngle<double>>(&local_2d0,&local_2d8,&local_2f0);
        TAngle<double>::operator=(&ViewPitch,&local_2d0);
        TAngle<double>::Normalized180(&local_300);
        TAngle<double>::operator=(&ViewRoll,&local_300);
        goto LAB_006370f9;
      }
    }
  }
  piVar7 = &pIStack_20->Old;
  deltaangle<double>(&local_320,&(pIStack_20->Old).Angles.Pitch);
  TAngle<double>::operator*(&local_318,(double)iview_local);
  TAngle<double>::operator+(&local_310,&(piVar7->Angles).Pitch);
  TAngle<double>::Normalized180(&local_308);
  TAngle<double>::operator=(&ViewPitch,&local_308);
  deltaangle<double>(&local_340,&nviewangle);
  TAngle<double>::operator*(&local_338,(double)iview_local);
  TAngle<double>::operator+(&local_330,&nviewangle);
  TAngle<double>::Normalized180(&local_328);
  TAngle<double>::operator=(&ViewAngle,&local_328);
  piVar7 = &pIStack_20->Old;
  deltaangle<double>(&local_360,&(pIStack_20->Old).Angles.Roll);
  TAngle<double>::operator*(&local_358,(double)iview_local);
  TAngle<double>::operator+(&local_350,&(piVar7->Angles).Roll);
  TAngle<double>::Normalized180(&local_348);
  TAngle<double>::operator=(&ViewRoll,&local_348);
LAB_006370f9:
  TVector2<double>::TVector2((TVector2<double> *)(local_388 + 0x18),&ViewPos);
  psVar5 = R_PointInSubsector((DVector2 *)(local_388 + 0x18));
  viewsector = (sector_t *)psVar5->sector;
  local_388[0x17] = 0;
  while ((bVar2 = sector_t::PortalBlocksMovement(viewsector,1), dVar10 = ViewPos.Z,
         ((bVar2 ^ 0xffU) & 1) != 0 &&
         (dVar9 = sector_t::GetPortalPlaneZ(viewsector,1), dVar9 < dVar10))) {
    sector_t::GetPortalDisplacement((sector_t *)local_388,(int)viewsector);
    TVector3<double>::operator+=(&ViewPos,(Vector2 *)local_388);
    TVector2<double>::TVector2((TVector2<double> *)(local_3a8 + 0x10),&ViewPos);
    psVar5 = R_PointInSubsector((DVector2 *)(local_3a8 + 0x10));
    viewsector = (sector_t *)psVar5->sector;
    local_388[0x17] = 1;
  }
  if ((local_388[0x17] & 1) == 0) {
    while ((bVar2 = sector_t::PortalBlocksMovement(viewsector,0), dVar10 = ViewPos.Z,
           ((bVar2 ^ 0xffU) & 1) != 0 &&
           (dVar9 = sector_t::GetPortalPlaneZ(viewsector,0), dVar10 < dVar9))) {
      sector_t::GetPortalDisplacement((sector_t *)local_3a8,(int)viewsector);
      TVector3<double>::operator+=(&ViewPos,(Vector2 *)local_3a8);
      TVector2<double>::TVector2(&local_3b8,&ViewPos);
      psVar5 = R_PointInSubsector(&local_3b8);
      viewsector = (sector_t *)psVar5->sector;
      local_388[0x17] = 1;
    }
  }
  return;
}

Assistant:

void R_InterpolateView (player_t *player, double Frac, InterpolationViewer *iview)
{
	if (NoInterpolateView)
	{
		InterpolationPath.Clear();
		NoInterpolateView = false;
		iview->Old = iview->New;
	}
	int oldgroup = R_PointInSubsector(iview->Old.Pos)->sector->PortalGroup;
	int newgroup = R_PointInSubsector(iview->New.Pos)->sector->PortalGroup;

	DAngle oviewangle = iview->Old.Angles.Yaw;
	DAngle nviewangle = iview->New.Angles.Yaw;
	if (!cl_capfps)
	{
		if ((iview->Old.Pos.X != iview->New.Pos.X || iview->Old.Pos.Y != iview->New.Pos.Y) && InterpolationPath.Size() > 0)
		{
			DVector3 view = iview->New.Pos;

			// Interpolating through line portals is a messy affair.
			// What needs be done is to store the portal transitions of the camera actor as waypoints
			// and then find out on which part of the path the current view lies.
			// Needless to say, this doesn't work for chasecam mode.
			if (!r_showviewer)
			{
				double pathlen = 0;
				double zdiff = 0;
				double totalzdiff = 0;
				DAngle adiff = 0.;
				DAngle totaladiff = 0.;
				double oviewz = iview->Old.Pos.Z;
				double nviewz = iview->New.Pos.Z;
				DVector3a oldpos = { { iview->Old.Pos.X, iview->Old.Pos.Y, 0 }, 0. };
				DVector3a newpos = { { iview->New.Pos.X, iview->New.Pos.Y, 0 }, 0. };
				InterpolationPath.Push(newpos);	// add this to  the array to simplify the loops below

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					pathlen += (end.pos - start.pos).Length();
					totalzdiff += start.pos.Z;
					totaladiff += start.angle;
				}
				double interpolatedlen = Frac * pathlen;

				for (unsigned i = 0; i < InterpolationPath.Size(); i += 2)
				{
					DVector3a &start = i == 0 ? oldpos : InterpolationPath[i - 1];
					DVector3a &end = InterpolationPath[i];
					double fraglen = (end.pos - start.pos).Length();
					zdiff += start.pos.Z;
					adiff += start.angle;
					if (fraglen <= interpolatedlen)
					{
						interpolatedlen -= fraglen;
					}
					else
					{
						double fragfrac = interpolatedlen / fraglen;
						oviewz += zdiff;
						nviewz -= totalzdiff - zdiff;
						oviewangle += adiff;
						nviewangle -= totaladiff - adiff;
						DVector2 viewpos = start.pos + (fragfrac * (end.pos - start.pos));
						ViewPos = { viewpos, oviewz + Frac * (nviewz - oviewz) };
						break;
					}
				}
				InterpolationPath.Pop();
				ViewPath[0] = iview->Old.Pos;
				ViewPath[1] = ViewPath[0] + (InterpolationPath[0].pos - ViewPath[0]).XY().MakeResize(pathlen);
			}
		}
		else
		{
			DVector2 disp = Displacements.getOffset(oldgroup, newgroup);
			ViewPos = iview->Old.Pos + (iview->New.Pos - iview->Old.Pos - disp) * Frac;
			ViewPath[0] = ViewPath[1] = iview->New.Pos;
		}
	}
	else
	{
		ViewPos = iview->New.Pos;
		ViewPath[0] = ViewPath[1] = iview->New.Pos;
	}
	if (player != NULL &&
		!(player->cheats & CF_INTERPVIEW) &&
		player - players == consoleplayer &&
		camera == player->mo &&
		!demoplayback &&
		iview->New.Pos.X == camera->X() &&
		iview->New.Pos.Y == camera->Y() && 
		!(player->cheats & (CF_TOTALLYFROZEN|CF_FROZEN)) &&
		player->playerstate == PST_LIVE &&
		player->mo->reactiontime == 0 &&
		!NoInterpolateView &&
		!paused &&
		(!netgame || !cl_noprediction) &&
		!LocalKeyboardTurner)
	{
		ViewAngle = (nviewangle + AngleToFloat(LocalViewAngle & 0xFFFF0000)).Normalized180();
		DAngle delta = player->centering ? DAngle(0.) : AngleToFloat(int(LocalViewPitch & 0xFFFF0000));
		ViewPitch = clamp<DAngle>((iview->New.Angles.Pitch - delta).Normalized180(), player->MinPitch, player->MaxPitch);
		ViewRoll = iview->New.Angles.Roll.Normalized180();
	}
	else
	{
		ViewPitch = (iview->Old.Angles.Pitch + deltaangle(iview->Old.Angles.Pitch, iview->New.Angles.Pitch) * Frac).Normalized180();
		ViewAngle = (oviewangle + deltaangle(oviewangle, nviewangle) * Frac).Normalized180();
		ViewRoll = (iview->Old.Angles.Roll + deltaangle(iview->Old.Angles.Roll, iview->New.Angles.Roll) * Frac).Normalized180();
	}
	
	// Due to interpolation this is not necessarily the same as the sector the camera is in.
	viewsector = R_PointInSubsector(ViewPos)->sector;
	bool moved = false;
	while (!viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		if (ViewPos.Z > viewsector->GetPortalPlaneZ(sector_t::ceiling))
		{
			ViewPos += viewsector->GetPortalDisplacement(sector_t::ceiling);
			viewsector = R_PointInSubsector(ViewPos)->sector;
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!viewsector->PortalBlocksMovement(sector_t::floor))
		{
			if (ViewPos.Z < viewsector->GetPortalPlaneZ(sector_t::floor))
			{
				ViewPos += viewsector->GetPortalDisplacement(sector_t::floor);
				viewsector = R_PointInSubsector(ViewPos)->sector;
				moved = true;
			}
			else break;
		}
	}
}